

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

int Fraig_CheckTfi_rec(Fraig_Man_t *pMan,Fraig_Node_t *pNode,Fraig_Node_t *pOld)

{
  int iVar1;
  
  while( true ) {
    if (pNode == (Fraig_Node_t *)0x0) {
      return 0;
    }
    if ((pNode->Num < pOld->Num) && (pMan->fChoicing == 0)) {
      return 0;
    }
    if (pNode == pOld) {
      return 1;
    }
    if (pNode->TravId == pMan->nTravIds) break;
    pNode->TravId = pMan->nTravIds;
    iVar1 = Fraig_CheckTfi_rec(pMan,(Fraig_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe),pOld);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = Fraig_CheckTfi_rec(pMan,(Fraig_Node_t *)((ulong)pNode->p2 & 0xfffffffffffffffe),pOld);
    if (iVar1 != 0) {
      return 1;
    }
    pNode = pNode->pNextE;
  }
  return 0;
}

Assistant:

int Fraig_CheckTfi_rec( Fraig_Man_t * pMan, Fraig_Node_t * pNode, Fraig_Node_t * pOld )
{
    // check the trivial cases
    if ( pNode == NULL )
        return 0;
    if ( pNode->Num < pOld->Num && !pMan->fChoicing )
        return 0;
    if ( pNode == pOld )
        return 1;
    // skip the visited node
    if ( pNode->TravId == pMan->nTravIds )
        return 0;
    pNode->TravId = pMan->nTravIds;
    // check the children
    if ( Fraig_CheckTfi_rec( pMan, Fraig_Regular(pNode->p1), pOld ) )
        return 1;
    if ( Fraig_CheckTfi_rec( pMan, Fraig_Regular(pNode->p2), pOld ) )
        return 1;
    // check equivalent nodes
    return Fraig_CheckTfi_rec( pMan, pNode->pNextE, pOld );
}